

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_option_desc_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (opt->description_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (opt->description_)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_option_desc(const Option *opt) const { return opt->get_description(); }